

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

CURLcode send_telnet_data(connectdata *conn,char *buffer,ssize_t nread)

{
  int iVar1;
  CURLcode CVar2;
  long lVar3;
  long lVar4;
  uchar outbuf [2];
  ssize_t bytes_written;
  pollfd pfd [1];
  char local_4a [2];
  ssize_t local_48;
  pollfd local_40;
  char *local_38;
  
  if (nread != 0) {
    do {
      local_4a[0] = *buffer;
      lVar3 = 1;
      if (local_4a[0] == -1) {
        local_4a[1] = 0xff;
        lVar3 = 2;
      }
      nread = nread + -1;
      local_38 = buffer + 1;
      lVar4 = 0;
      do {
        local_40.fd = conn->sock[0];
        local_40.events = 4;
        iVar1 = Curl_poll(&local_40,1,-1);
        CVar2 = CURLE_SEND_ERROR;
        if (1 < iVar1 + 1U) {
          local_48 = 0;
          CVar2 = Curl_write(conn,conn->sock[0],local_4a + lVar4,lVar3 - lVar4,&local_48);
          lVar4 = lVar4 + local_48;
        }
      } while ((CVar2 == CURLE_OK) && (lVar4 < lVar3));
    } while ((CVar2 == CURLE_OK) && (buffer = local_38, nread != 0));
    return CVar2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode send_telnet_data(struct connectdata *conn,
                                 char *buffer, ssize_t nread)
{
  unsigned char outbuf[2];
  ssize_t bytes_written, total_written;
  int out_count;
  CURLcode result = CURLE_OK;

  while(!result && nread--) {
    outbuf[0] = *buffer++;
    out_count = 1;
    if(outbuf[0] == CURL_IAC)
      outbuf[out_count++] = CURL_IAC;

    total_written = 0;
    do {
      /* Make sure socket is writable to avoid EWOULDBLOCK condition */
      struct pollfd pfd[1];
      pfd[0].fd = conn->sock[FIRSTSOCKET];
      pfd[0].events = POLLOUT;
      switch(Curl_poll(pfd, 1, -1)) {
        case -1:                    /* error, abort writing */
        case 0:                     /* timeout (will never happen) */
          result = CURLE_SEND_ERROR;
          break;
        default:                    /* write! */
          bytes_written = 0;
          result = Curl_write(conn, conn->sock[FIRSTSOCKET],
                              outbuf+total_written, out_count-total_written,
                              &bytes_written);
          total_written += bytes_written;
          break;
      }
      /* handle partial write */
    } while(!result && total_written < out_count);
  }
  return result;
}